

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase(FILE *out,TestCase *test_case)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  TestCase *in_RSI;
  FILE *in_RDI;
  stringstream stream;
  int i;
  char *in_stack_fffffffffffffda8;
  String *in_stack_fffffffffffffdb0;
  FILE *pFVar7;
  TestInfo *in_stack_fffffffffffffdb8;
  int i_00;
  TestCase *local_230;
  String local_1f0;
  stringstream local_1e0 [16];
  TestCase aTStack_1d0 [2];
  TimeInMillis in_stack_ffffffffffffff48;
  int local_54;
  TestInfo *in_stack_ffffffffffffffb0;
  stringstream *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  String local_20;
  TestCase *local_10;
  FILE *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  TestCase::name((TestCase *)0x249c51);
  EscapeXmlAttribute(in_stack_fffffffffffffda8);
  pcVar5 = String::c_str(&local_20);
  uVar1 = TestCase::total_test_count((TestCase *)0x249c84);
  uVar2 = TestCase::failed_test_count((TestCase *)0x249c95);
  uVar3 = TestCase::disabled_test_count((TestCase *)0x249ca8);
  fprintf(in_RDI,"  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" disabled=\"%d\" ",pcVar5,
          (ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  String::~String(in_stack_fffffffffffffdb0);
  pFVar7 = local_8;
  TestCase::elapsed_time(local_10);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_ffffffffffffff48);
  uVar6 = std::__cxx11::string::c_str();
  fprintf(pFVar7,"errors=\"0\" time=\"%s\">\n",uVar6);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  local_54 = 0;
  while( true ) {
    i_00 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    iVar4 = TestCase::total_test_count((TestCase *)0x249d5e);
    if (iVar4 <= local_54) break;
    std::__cxx11::stringstream::stringstream(local_1e0);
    local_230 = (TestCase *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e0) {
      local_230 = aTStack_1d0;
    }
    TestCase::name((TestCase *)0x249dad);
    in_stack_fffffffffffffdb8 = TestCase::GetTestInfo(local_230,i_00);
    OutputXmlTestInfo(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb0);
    pFVar7 = local_8;
    StringStreamToString(in_stack_ffffffffffffffb8);
    pcVar5 = String::c_str(&local_1f0);
    fprintf(pFVar7,"%s",pcVar5);
    String::~String((String *)pFVar7);
    std::__cxx11::stringstream::~stringstream(local_1e0);
    local_54 = local_54 + 1;
  }
  fprintf(local_8,"  </testsuite>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(FILE* out,
                                                const TestCase& test_case) {
  fprintf(out,
          "  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" "
          "disabled=\"%d\" ",
          EscapeXmlAttribute(test_case.name()).c_str(),
          test_case.total_test_count(),
          test_case.failed_test_count(),
          test_case.disabled_test_count());
  fprintf(out,
          "errors=\"0\" time=\"%s\">\n",
          FormatTimeInMillisAsSeconds(test_case.elapsed_time()).c_str());
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    ::std::stringstream stream;
    OutputXmlTestInfo(&stream, test_case.name(), *test_case.GetTestInfo(i));
    fprintf(out, "%s", StringStreamToString(&stream).c_str());
  }
  fprintf(out, "  </testsuite>\n");
}